

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O3

void __thiscall
QGraphicsWidgetPrivate::windowFrameMouseReleaseEvent
          (QGraphicsWidgetPrivate *this,QGraphicsSceneMouseEvent *event)

{
  QGraphicsItem *pQVar1;
  QMarginsF *pQVar2;
  char cVar3;
  int iVar4;
  QFlagsStorage<Qt::MouseButton> QVar5;
  pointer __old_p;
  WindowData *pWVar6;
  QStyle *pQVar7;
  QWidget *pQVar8;
  QGraphicsItem *this_00;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  QPointF QVar13;
  double local_e8;
  double dStack_e0;
  undefined8 local_d0;
  QRectF local_c8;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsItemPrivate).q_ptr;
  pWVar6 = (this->windowData)._M_t.
           super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
           ._M_t.
           super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
           .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl;
  this_00 = pQVar1 + -1;
  if (pQVar1 == (QGraphicsItem *)0x0) {
    this_00 = (QGraphicsItem *)0x0;
  }
  if (pWVar6 == (WindowData *)0x0) {
    pWVar6 = (WindowData *)operator_new(0x58);
    (pWVar6->startGeometry).xp = 0.0;
    (pWVar6->startGeometry).yp = 0.0;
    (pWVar6->startGeometry).w = 0.0;
    (pWVar6->startGeometry).h = 0.0;
    (pWVar6->buttonRect).x1 = 0;
    (pWVar6->buttonRect).y1 = 0;
    (pWVar6->windowTitle).d.d = 0;
    *(char16_t **)((long)&(pWVar6->windowTitle).d + 8) = (char16_t *)0x0;
    *(qsizetype *)((long)&(pWVar6->windowTitle).d + 0x10) = 0;
    pWVar6->hoveredSubControl = SC_None;
    pWVar6->grabbedSection = NoSection;
    pWVar6->field_0x20 = 0;
    (pWVar6->buttonRect).x2 = -1;
    (pWVar6->buttonRect).y2 = -1;
    (this->windowData)._M_t.
    super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
    ._M_t.
    super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
    .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl = pWVar6;
  }
  if (pWVar6->grabbedSection != NoSection) {
    if (pWVar6->grabbedSection == TitleBarArea) {
      pWVar6->field_0x20 = pWVar6->field_0x20 & 0xfd;
      local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)local_a8);
      initStyleOptionTitleBar(this,(QStyleOptionTitleBar *)local_a8);
      QGraphicsWidget::windowFrameRect(&local_c8,(QGraphicsWidget *)this_00);
      auVar9._0_8_ = (double)((ulong)local_c8.xp & 0x8000000000000000 | 0x3fe0000000000000) +
                     local_c8.xp;
      auVar9._8_8_ = (double)((ulong)local_c8.yp & 0x8000000000000000 | 0x3fe0000000000000) +
                     local_c8.yp;
      auVar12 = maxpd(auVar9,_DAT_006605e0);
      dVar10 = (local_c8.xp -
               (double)(int)(double)(~-(ulong)(2147483647.0 < auVar9._0_8_) & auVar12._0_8_ |
                                    -(ulong)(2147483647.0 < auVar9._0_8_) & 0x41dfffffffc00000)) *
               0.5 + local_c8.w;
      dVar11 = (local_c8.yp -
               (double)(int)(double)(~-(ulong)(2147483647.0 < auVar9._8_8_) & auVar12._8_8_ |
                                    -(ulong)(2147483647.0 < auVar9._8_8_) & 0x41dfffffffc00000)) *
               0.5 + local_c8.h;
      auVar12._0_8_ = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
      auVar12._8_8_ = (double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) + dVar11;
      auVar9 = maxpd(auVar12,_DAT_006605e0);
      uStack_90._0_4_ =
           (int)(double)(~-(ulong)(2147483647.0 < auVar12._0_8_) & auVar9._0_8_ |
                        -(ulong)(2147483647.0 < auVar12._0_8_) & 0x41dfffffffc00000) + -1;
      uStack_90._4_4_ =
           (int)(double)(~-(ulong)(2147483647.0 < auVar12._8_8_) & auVar9._8_8_ |
                        -(ulong)(2147483647.0 < auVar12._8_8_) & 0x41dfffffffc00000) + -1;
      local_98._0_4_ = 0;
      local_98._4_4_ = 0;
      pQVar7 = QGraphicsWidget::style((QGraphicsWidget *)this_00);
      iVar4 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x1a,(QStyleOptionTitleBar *)local_a8,0);
      uStack_90._4_4_ = iVar4 + local_98._4_4_ + -1;
      QVar13 = QGraphicsSceneMouseEvent::pos(event);
      dVar10 = QVar13.yp;
      pQVar2 = (this->windowFrameMargins)._M_t.
               super___uniq_ptr_impl<QMarginsF,_std::default_delete<QMarginsF>_>._M_t.
               super__Tuple_impl<0UL,_QMarginsF_*,_std::default_delete<QMarginsF>_>.
               super__Head_base<0UL,_QMarginsF_*,_false>._M_head_impl;
      if (pQVar2 != (QMarginsF *)0x0) {
        QVar13.xp = QVar13.xp + pQVar2->m_left;
        QVar13.yp = dVar10 + pQVar2->m_top;
      }
      local_68 = (undefined1 *)
                 CONCAT44(local_68._4_4_,(QFlagsStorageHelper<QStyle::SubControl,_4>)0x8);
      pQVar7 = QGraphicsWidget::style((QGraphicsWidget *)this_00);
      pQVar8 = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
      local_c8._0_16_ = (**(code **)(*(long *)pQVar7 + 0xd8))(pQVar7,5,local_a8,8,pQVar8);
      local_e8 = QVar13.xp;
      dStack_e0 = QVar13.yp;
      local_e8 = (double)((ulong)local_e8 & 0x8000000000000000 | 0x3fe0000000000000) + local_e8;
      dVar10 = local_e8;
      if (local_e8 <= -2147483648.0) {
        dVar10 = -2147483648.0;
      }
      dStack_e0 = (double)((ulong)dStack_e0 & 0x8000000000000000 | 0x3fe0000000000000) + dStack_e0;
      dVar11 = dStack_e0;
      if (dStack_e0 <= -2147483648.0) {
        dVar11 = -2147483648.0;
      }
      local_d0 = CONCAT44((int)(double)(-(ulong)(2147483647.0 < dStack_e0) & 0x41dfffffffc00000 |
                                       ~-(ulong)(2147483647.0 < dStack_e0) & (ulong)dVar11),
                          (int)(double)(-(ulong)(2147483647.0 < local_e8) & 0x41dfffffffc00000 |
                                       ~-(ulong)(2147483647.0 < local_e8) & (ulong)dVar10));
      iVar4 = (int)&local_d0;
      cVar3 = QRect::contains((QPoint *)&local_c8,SUB81(&local_d0,0));
      if (cVar3 != '\0') {
        QGraphicsWidget::close((QGraphicsWidget *)this_00,iVar4);
      }
      QIcon::~QIcon(&local_48);
      if (pQStack_60 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_60,2,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_a8);
    }
    QVar5.i = (Int)QGraphicsSceneMouseEvent::buttons(event);
    if ((QFlagsStorage<Qt::MouseButton>)QVar5.i == (QFlagsStorage<Qt::MouseButton>)0x0) {
      ((this->windowData)._M_t.
       super___uniq_ptr_impl<QGraphicsWidgetPrivate::WindowData,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
       ._M_t.
       super__Tuple_impl<0UL,_QGraphicsWidgetPrivate::WindowData_*,_std::default_delete<QGraphicsWidgetPrivate::WindowData>_>
       .super__Head_base<0UL,_QGraphicsWidgetPrivate::WindowData_*,_false>._M_head_impl)->
      grabbedSection = NoSection;
    }
    (event->super_QGraphicsSceneEvent).field_0xc = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidgetPrivate::windowFrameMouseReleaseEvent(QGraphicsSceneMouseEvent *event)
{
    Q_Q(QGraphicsWidget);
    ensureWindowData();
    if (windowData->grabbedSection != Qt::NoSection) {
        if (windowData->grabbedSection == Qt::TitleBarArea) {
            windowData->buttonSunken = false;
            QStyleOptionTitleBar bar;
            initStyleOptionTitleBar(&bar);
            // make sure that the coordinates (rect and pos) we send to the style are positive.
            bar.rect = q->windowFrameRect().toRect();
            bar.rect.moveTo(0,0);
            bar.rect.setHeight(q->style()->pixelMetric(QStyle::PM_TitleBarHeight, &bar));
            QPointF pos = event->pos();
            if (windowFrameMargins) {
                pos.rx() += windowFrameMargins->left();
                pos.ry() += windowFrameMargins->top();
            }
            bar.subControls = QStyle::SC_TitleBarCloseButton;
            if (q->style()->subControlRect(QStyle::CC_TitleBar, &bar,
                                           QStyle::SC_TitleBarCloseButton,
                                           event->widget()).contains(pos.toPoint())) {
                q->close();
            }
        }
        if (!(static_cast<QGraphicsSceneMouseEvent *>(event)->buttons()))
            windowData->grabbedSection = Qt::NoSection;
        event->accept();
    }
}